

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.h
# Opt level: O3

void JsUtil::
     QuickSort<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>,_int_(*)(void_*,_const_void_*,_const_void_*)>
     ::Sort(WriteBarrierPtr<void> *base,size_t nmemb,size_t size,
           _func_int_void_ptr_void_ptr_void_ptr *comparer,void *context)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  WriteBarrierPtr<void> *pWVar4;
  ulong uVar5;
  WriteBarrierPtr<void> *pWVar6;
  WriteBarrierPtr<void> *pWVar7;
  WriteBarrierPtr<void> *pWVar8;
  WriteBarrierPtr<void> *b;
  WriteBarrierPtr<void> *b_00;
  size_t nmemb_00;
  WriteBarrierPtr<void> *pWVar9;
  WriteBarrierPtr<void> *pWVar10;
  
  if (base == (WriteBarrierPtr<void> *)0x0) {
    return;
  }
  while (9 < nmemb) {
    pWVar9 = base + (nmemb >> 2) * size;
    iVar1 = (*comparer)(context,pWVar9,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar9,size);
    }
    uVar2 = (nmemb - 1) * size;
    pWVar8 = base + uVar2;
    pWVar4 = base + (nmemb * 3 >> 2) * size;
    iVar1 = (*comparer)(context,pWVar8,pWVar4);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar4,pWVar8,size);
    }
    uVar3 = (nmemb >> 1) * size;
    pWVar10 = base + uVar3;
    iVar1 = (*comparer)(context,pWVar8,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar4,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar10,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar8,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar10,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar10,size);
    }
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar8,pWVar10,size);
    if (uVar3 == 0) {
      nmemb_00 = 0;
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      nmemb_00 = 0;
      pWVar9 = base;
      do {
        iVar1 = (*comparer)(context,pWVar9,pWVar8);
        if (iVar1 < 1) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar9,base + nmemb_00 * size,size);
          nmemb_00 = nmemb_00 + 1;
        }
        uVar5 = uVar5 + size;
        pWVar9 = pWVar9 + size;
      } while (uVar5 < uVar3);
    }
    if (uVar5 < uVar2) {
      pWVar9 = base + uVar5;
      do {
        iVar1 = (*comparer)(context,pWVar9,pWVar8);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar9,base + nmemb_00 * size,size);
          nmemb_00 = nmemb_00 + 1;
        }
        uVar5 = uVar5 + size;
        pWVar9 = pWVar9 + size;
      } while (uVar5 < uVar2);
    }
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (base + nmemb_00 * size,pWVar8,size);
    Sort(base,nmemb_00,size,comparer,context);
    nmemb = nmemb - (nmemb_00 + 1);
    base = base + (nmemb_00 + 1) * size;
    if (base == (WriteBarrierPtr<void> *)0x0) {
      return;
    }
  }
  switch(nmemb) {
  case 2:
    iVar1 = (*comparer)(context,base + size,base);
    break;
  case 3:
    pWVar9 = base + size;
    iVar1 = (*comparer)(context,pWVar9,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar9,size);
    }
    iVar1 = (*comparer)(context,base + size * 2,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,base + size * 2,size);
    }
    iVar1 = (*comparer)(context,pWVar9,base);
    break;
  case 4:
    pWVar9 = base + size;
    iVar1 = (*comparer)(context,pWVar9,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar9,size);
    }
    pWVar8 = base + size * 3;
    pWVar10 = base + size * 2;
    iVar1 = (*comparer)(context,pWVar8,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar10,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar8,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar10,pWVar9);
    goto joined_r0x00af256a;
  case 5:
    pWVar9 = base + size;
    iVar1 = (*comparer)(context,pWVar9,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar9,size);
    }
    pWVar4 = base + size * 4;
    pWVar8 = base + size * 3;
    iVar1 = (*comparer)(context,pWVar4,pWVar8);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar8,pWVar4,size);
    }
    pWVar10 = base + size * 2;
    iVar1 = (*comparer)(context,pWVar4,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar8,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar8,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar10,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar8,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar10,pWVar9);
joined_r0x00af256a:
    b_00 = base + size;
    goto joined_r0x00af2ea7;
  case 6:
    b_00 = base + size * 2;
    pWVar9 = base + size;
    iVar1 = (*comparer)(context,b_00,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,b_00,size);
    }
    iVar1 = (*comparer)(context,b_00,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,b_00,size);
    }
    iVar1 = (*comparer)(context,pWVar9,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar9,size);
    }
    pWVar8 = base + size * 5;
    pWVar4 = base + size * 4;
    iVar1 = (*comparer)(context,pWVar8,pWVar4);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar4,pWVar8,size);
    }
    pWVar10 = base + size * 3;
    iVar1 = (*comparer)(context,pWVar8,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar10,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar8,b_00);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (b_00,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar4,b_00);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (b_00,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar10,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar10,b_00);
    goto joined_r0x00af2ea7;
  case 7:
    b_00 = base + size * 2;
    pWVar9 = base + size;
    iVar1 = (*comparer)(context,b_00,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,b_00,size);
    }
    iVar1 = (*comparer)(context,b_00,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,b_00,size);
    }
    iVar1 = (*comparer)(context,pWVar9,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar9,size);
    }
    pWVar8 = base + size * 4;
    pWVar10 = base + size * 3;
    iVar1 = (*comparer)(context,pWVar8,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar8,size);
    }
    pWVar6 = base + size * 6;
    pWVar4 = base + size * 5;
    iVar1 = (*comparer)(context,pWVar6,pWVar4);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar4,pWVar6,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar6,pWVar8);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar8,pWVar6,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar8);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar8,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar8,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar10,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar6,b_00);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (b_00,pWVar6,size);
    }
    iVar1 = (*comparer)(context,pWVar4,b_00);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (b_00,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar10,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar8,b_00);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (b_00,pWVar8,size);
    }
    goto LAB_00af2bb9;
  case 8:
    pWVar9 = base + size;
    iVar1 = (*comparer)(context,pWVar9,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar9,size);
    }
    b_00 = base + size * 3;
    pWVar8 = base + size * 2;
    iVar1 = (*comparer)(context,b_00,pWVar8);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar8,b_00,size);
    }
    iVar1 = (*comparer)(context,pWVar8,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar8,size);
    }
    iVar1 = (*comparer)(context,b_00,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,b_00,size);
    }
    iVar1 = (*comparer)(context,pWVar8,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar8,size);
    }
    pWVar4 = base + size * 5;
    pWVar10 = base + size * 4;
    iVar1 = (*comparer)(context,pWVar4,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar4,size);
    }
    pWVar6 = base + size * 7;
    pWVar7 = base + size * 6;
    iVar1 = (*comparer)(context,pWVar6,pWVar7);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar7,pWVar6,size);
    }
    iVar1 = (*comparer)(context,pWVar7,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar7,size);
    }
    iVar1 = (*comparer)(context,pWVar6,pWVar4);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar4,pWVar6,size);
    }
    iVar1 = (*comparer)(context,pWVar7,pWVar4);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar4,pWVar7,size);
    }
    iVar1 = (*comparer)(context,pWVar10,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar10,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar7,pWVar8);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar8,pWVar7,size);
    }
    iVar1 = (*comparer)(context,pWVar6,b_00);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (b_00,pWVar6,size);
    }
    iVar1 = (*comparer)(context,pWVar7,b_00);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (b_00,pWVar7,size);
    }
    iVar1 = (*comparer)(context,pWVar10,pWVar8);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar8,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar4,b_00);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (b_00,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar10,b_00);
    goto joined_r0x00af2ea7;
  case 9:
    pWVar9 = base + size;
    iVar1 = (*comparer)(context,pWVar9,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar9,size);
    }
    pWVar4 = base + size * 4;
    pWVar8 = base + size * 3;
    iVar1 = (*comparer)(context,pWVar4,pWVar8);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar8,pWVar4,size);
    }
    pWVar6 = base + size * 7;
    pWVar10 = base + size * 6;
    iVar1 = (*comparer)(context,pWVar6,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar6,size);
    }
    pWVar7 = base + size * 2;
    iVar1 = (*comparer)(context,pWVar7,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar7,size);
    }
    b_00 = base + size * 5;
    iVar1 = (*comparer)(context,b_00,pWVar4);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar4,b_00,size);
    }
    b = base + size * 8;
    iVar1 = (*comparer)(context,b,pWVar6);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar6,b,size);
    }
    iVar1 = (*comparer)(context,pWVar9,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar9,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar8);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar8,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar6,pWVar10);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar10,pWVar6,size);
    }
    iVar1 = (*comparer)(context,pWVar8,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar10,pWVar8);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar8,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar8,base);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (base,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar6,pWVar4);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar4,pWVar6,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar4,size);
    }
    iVar1 = (*comparer)(context,b_00,pWVar7);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar7,b_00,size);
    }
    iVar1 = (*comparer)(context,b,b_00);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (b_00,b,size);
    }
    iVar1 = (*comparer)(context,b_00,pWVar7);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar7,b_00,size);
    }
    iVar1 = (*comparer)(context,pWVar8,pWVar9);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar9,pWVar8,size);
    }
    iVar1 = (*comparer)(context,pWVar6,b_00);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (b_00,pWVar6,size);
    }
    iVar1 = (*comparer)(context,pWVar10,pWVar7);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar7,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar10,pWVar4);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar4,pWVar10,size);
    }
    iVar1 = (*comparer)(context,pWVar4,pWVar7);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar7,pWVar4,size);
    }
    iVar1 = (*comparer)(context,pWVar8,pWVar7);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar7,pWVar8,size);
    }
LAB_00af2bb9:
    iVar1 = (*comparer)(context,pWVar10,b_00);
    goto joined_r0x00af2ea7;
  default:
    return;
  }
  pWVar10 = base + size;
  b_00 = base;
joined_r0x00af2ea7:
  if (-1 < iVar1) {
    return;
  }
  QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
            (b_00,pWVar10,size);
  return;
}

Assistant:

static void Sort(T* base, size_t nmemb, size_t size, Comparer comparer, void* context)
        {
            if (!base)
            {
                return;
            }

            if (nmemb <= 9) // use sorting networks for members <= 2^3
            {
                switch(nmemb)
                {
                    case 9:
                        CCQ_SORT9()
                        break;
                    case 8:
                        CCQ_SORT8()
                        break;
                    case 7:
                        CCQ_SORT7()
                        break;
                    case 6:
                        CCQ_SORT6()
                        break;
                    case 5:
                        CCQ_SORT5(0, 1, 2, 3, 4)
                        break;
                    case 4:
                        CCQ_SORT4()
                        break;
                    case 3:
                        CCQ_SORT3()
                        break;
                    case 2:
                        CCQ_SORT2(0, 1)
                        break;
                    default:
                        break; // nothing to sort
                }

                return;
            }

            CCQ_SORT5(0, (nmemb / 4), (nmemb / 2), ((3 * nmemb) / 4), (nmemb - 1));
            // guess the median is in the middle now.
            size_t pos = 0;
            const size_t pivot = (nmemb - 1) * size;
            // make last element the median(pivot)
            CCQ_SWAP(base + pivot, base + ((nmemb / 2) * size), size);

            // standard qsort pt. below
            size_t i = 0;
            for (; i < nmemb / 2 * size; i+= size)
            {
                // During the first half, count equal values as below the pivot
                if (comparer(context, base + i, base + pivot) <= 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            for (; i < pivot; i+= size)
            {
                // During the second half, count equal values as above the pivot
                if (comparer(context, base + i, base + pivot) < 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            // issue the last change
            CCQ_SWAP(base + (pos * size), base + pivot, size);

            Sort(base, pos++, size, comparer, context);
            Sort(base + (pos * size), nmemb - pos, size, comparer, context);
        }